

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_bonsai_trie
          (compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,compact_bonsai_trie<95U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                 *param_2)

{
  undefined4 uVar1;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_RSI;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_RDI;
  
  uVar1 = *(undefined4 *)&(in_RSI->hasher_).field_0x4;
  (in_RDI->hasher_).shift_ = (in_RSI->hasher_).shift_;
  *(undefined4 *)&(in_RDI->hasher_).field_0x4 = uVar1;
  uVar1 = *(undefined4 *)&(in_RSI->hasher_).univ_size_.field_0x4;
  (in_RDI->hasher_).univ_size_.bits_ = (in_RSI->hasher_).univ_size_.bits_;
  *(undefined4 *)&(in_RDI->hasher_).univ_size_.field_0x4 = uVar1;
  (in_RDI->hasher_).univ_size_.mask_ = (uint64_t)(in_RSI->hasher_).univ_size_.mask_;
  compact_vector::compact_vector((compact_vector *)in_RSI,(compact_vector *)in_RDI);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (in_RSI,in_RDI);
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::standard_hash_table
            ((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)in_RSI,
             (standard_hash_table<80U,_poplar::hash::vigna_hasher> *)in_RDI);
  memcpy(&in_RDI[1].quo_size_.mask_,&in_RSI[1].quo_size_.mask_,0x30);
  return;
}

Assistant:

compact_bonsai_trie(compact_bonsai_trie&&) noexcept = default;